

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

void __thiscall
helics::NetworkCommsInterface::loadNetworkInfo
          (NetworkCommsInterface *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  undefined1 uVar2;
  __int_type_conflict _Var3;
  ostream *this_00;
  long in_RSI;
  long in_RDI;
  InterfaceNetworks in_stack_00000027;
  string *in_stack_00000028;
  string bTarget;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  __int_type_conflict in_stack_ffffffffffffff84;
  CommsInterface *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  CommsInterface::loadNetworkInfo
            ((CommsInterface *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (NetworkBrokerData *)in_stack_ffffffffffffff88);
  bVar1 = CommsInterface::propertyLock(in_stack_ffffffffffffff88);
  if (!bVar1) {
    return;
  }
  *(undefined4 *)(in_RDI + 0x410) = *(undefined4 *)(in_RSI + 0xa4);
  CLI::std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  *(undefined4 *)(in_RDI + 0x424) = *(undefined4 *)(in_RSI + 0xb8);
  if (*(byte *)(in_RDI + 0x41e) < 2) {
    gmlc::networking::removeProtocol
              ((string *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    gmlc::networking::removeProtocol
              ((string *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x452014);
  if (!bVar1) goto LAB_00452162;
  in_stack_ffffffffffffff88 = (CommsInterface *)&stack0xffffffffffffffd0;
  gmlc::networking::stripProtocol((string *)in_stack_ffffffffffffff88);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
  if ((bool)uVar2) {
LAB_0045207a:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff84 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
    if (bVar1) goto LAB_0045207a;
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4520c0);
    if (bVar1) {
      if (*(char *)(in_RDI + 0x3c1) == '\0') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff78);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_ffffffffffffff90),(size_type)in_stack_ffffffffffffff88,
                   (char)((uint)in_stack_ffffffffffffff84 >> 0x18));
      }
    }
    else {
      gmlc::networking::generateMatchingInterfaceAddress(in_stack_00000028,in_stack_00000027);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
LAB_00452162:
  if (0 < *(int *)(in_RSI + 0xac)) {
    PortAllocator::setStartingPortNumber((PortAllocator *)(in_RDI + 0x428),*(int *)(in_RSI + 0xac));
  }
  if ((*(byte *)(in_RDI + 0x25a) & 1) == 0) {
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_ffffffffffffff88);
    if ((_Var3 < 0) && (-1 < *(int *)(in_RSI + 0xa8))) {
      CLI::std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    }
  }
  else if ((*(int *)(in_RDI + 0x410) < 0) && (-1 < *(int *)(in_RSI + 0xa8))) {
    *(undefined4 *)(in_RDI + 0x410) = *(undefined4 *)(in_RSI + 0xa8);
  }
  _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_ffffffffffffff88);
  if (0 < _Var3) {
    *(undefined1 *)(in_RDI + 0x418) = 0;
  }
  *(byte *)(in_RDI + 0x419) = *(byte *)(in_RSI + 0xbe) & 1;
  *(byte *)(in_RDI + 0x41a) = *(byte *)(in_RSI + 0xc0) & 1;
  *(byte *)(in_RDI + 0x41b) = *(byte *)(in_RSI + 0xc1) & 1;
  *(byte *)(in_RDI + 0x25d) = *(byte *)(in_RSI + 0xc2) & 1;
  *(byte *)(in_RDI + 0x41c) = *(byte *)(in_RSI + 0xc5) & 1;
  *(byte *)(in_RDI + 0x41d) = *(byte *)(in_RSI + 0xc6) & 1;
  if ((*(byte *)(in_RDI + 0x41c) & 1) != 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "encryption not enabled in HELICS, recompile with encryption enabled if required"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  CommsInterface::propertyUnLock
            ((CommsInterface *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return;
}

Assistant:

void NetworkCommsInterface::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    using gmlc::networking::InterfaceTypes;
    using gmlc::networking::removeProtocol;

    CommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    brokerPort = netInfo.brokerPort;
    PortNumber = netInfo.portNumber;
    maxRetries = netInfo.maxRetries;
    switch (networkType) {
        case InterfaceTypes::TCP:
        case InterfaceTypes::UDP:
            removeProtocol(brokerTargetAddress);
            removeProtocol(localTargetAddress);
            break;
        default:
            break;
    }
    if (localTargetAddress.empty()) {
        auto bTarget = gmlc::networking::stripProtocol(brokerTargetAddress);
        if ((bTarget == localHostString) || (bTarget == "127.0.0.1")) {
            localTargetAddress = localHostString;
        } else if (bTarget.empty()) {
            switch (interfaceNetwork) {
                case gmlc::networking::InterfaceNetworks::LOCAL:
                    localTargetAddress = localHostString;
                    break;
                default:
                    localTargetAddress.assign(1, '*');
                    break;
            }
        } else {
            localTargetAddress =
                generateMatchingInterfaceAddress(brokerTargetAddress, interfaceNetwork);
        }
    }

    if (netInfo.portStart > 0) {
        openPorts.setStartingPortNumber(netInfo.portStart);
    }

    if (mRequireBrokerConnection) {
        if (brokerPort < 0 && netInfo.connectionPort >= 0) {
            brokerPort = netInfo.connectionPort;
        }
    } else {
        if (PortNumber < 0 && netInfo.connectionPort >= 0) {
            PortNumber = netInfo.connectionPort;
        }
    }

    if (PortNumber > 0) {
        autoPortNumber = false;
    }
    useOsPortAllocation = netInfo.use_os_port;
    appendNameToAddress = netInfo.appendNameToAddress;
    noAckConnection = netInfo.noAckConnection;
    useJsonSerialization = netInfo.useJsonSerialization;
    encrypted = netInfo.encrypted;
    forceConnection = netInfo.forceConnection;
#ifndef HELICS_ENABLE_ENCRYPTION
    if (encrypted) {
        std::cerr
            << "encryption not enabled in HELICS, recompile with encryption enabled if required"
            << std::endl;
    }
#endif
    propertyUnLock();
}